

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.h
# Opt level: O2

void __thiscall LEFReader::~LEFReader(LEFReader *this)

{
  this->_vptr_LEFReader = (_func_int **)&PTR__LEFReader_00140308;
  std::__cxx11::string::~string((string *)&this->m_tokstr);
  return;
}

Assistant:

virtual ~LEFReader() {}